

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O2

bool __thiscall
jsoncons::basic_json_visitor<wchar_t>::visit_begin_multi_dim
          (basic_json_visitor<wchar_t> *this,
          span<const_unsigned_long,_18446744073709551615UL> *shape,semantic_tag tag,
          ser_context *context,error_code *ec)

{
  pointer puVar1;
  undefined7 in_register_00000011;
  pointer puVar2;
  
  (*this->_vptr_basic_json_visitor[7])(this,2);
  (*this->_vptr_basic_json_visitor[7])
            (this,shape->size_,CONCAT71(in_register_00000011,tag) & 0xffffffff,context,ec);
  puVar1 = shape->data_;
  for (puVar2 = puVar1; puVar2 != puVar1 + shape->size_; puVar2 = puVar2 + 1) {
    (*this->_vptr_basic_json_visitor[0xf])(this,*puVar2,0,context,ec);
    puVar1 = shape->data_;
  }
  (*this->_vptr_basic_json_visitor[8])(this,context,ec);
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_begin_multi_dim(const jsoncons::span<const size_t>& shape,
            semantic_tag tag,
            const ser_context& context, 
            std::error_code& ec) 
        {
            visit_begin_array(2, tag, context, ec);
            visit_begin_array(shape.size(), tag, context, ec);
            for (auto it = shape.begin(); it != shape.end(); ++it)
            {
                visit_uint64(*it, semantic_tag::none, context, ec);
            }
            visit_end_array(context, ec);
            JSONCONS_VISITOR_RETURN;
        }